

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx_trim(char *dest,int dest_sz,char *src,char *trim)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char cVar7;
  
  uVar2 = sx_strlen(src);
  uVar1 = dest_sz - 1U;
  if ((int)uVar2 < (int)(dest_sz - 1U)) {
    uVar1 = uVar2;
  }
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      cVar7 = *trim;
      pcVar6 = trim + 1;
      while (cVar7 != '\0') {
        if (src[uVar5] == cVar7) goto LAB_0010b74a;
        cVar7 = *pcVar6;
        pcVar6 = pcVar6 + 1;
      }
      iVar3 = (int)uVar4;
      uVar4 = (ulong)(iVar3 + 1);
      dest[iVar3] = src[uVar5];
LAB_0010b74a:
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
    uVar4 = (ulong)(int)uVar4;
  }
  dest[uVar4] = '\0';
  return dest;
}

Assistant:

char* sx_trim(char* dest, int dest_sz, const char* src, const char* trim)
{
    int len = sx_min(sx_strlen(src), dest_sz - 1);
    int offset = 0;
    for (int i = 0; i < len; i++) {
        const char* t = trim;
        char sch = src[i];
        bool trim_it = false;
        while (*t) {
            if (sch != *t) {
                ++t;
                continue;
            }
            trim_it = true;
            break;
        }

        if (!trim_it)
            dest[offset++] = src[i];
    }
    dest[offset] = '\0';
    return dest;
}